

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RedirectedStdErr::RedirectedStdErr(RedirectedStdErr *this)

{
  RedirectedStream *this_00;
  ostream *extraout_RAX;
  ReusableStringStream *in_RDI;
  double __z;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  ostream *redirectionStream;
  ostream *in_stack_ffffffffffffffb8;
  ostream *originalStream;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
  cerr();
  this_00 = (RedirectedStream *)ReusableStringStream::get(in_RDI);
  RedirectedStream::RedirectedStream
            (this_00,in_stack_ffffffffffffffb8,(ostream *)in_stack_ffffffffffffffb0);
  redirectionStream = (ostream *)&in_RDI[2].m_oss;
  clog(__z);
  originalStream = extraout_RAX;
  ReusableStringStream::get(in_RDI);
  RedirectedStream::RedirectedStream(this_00,originalStream,redirectionStream);
  return;
}

Assistant:

RedirectedStdErr::RedirectedStdErr()
    :   m_cerr( Catch::cerr(), m_rss.get() ),
        m_clog( Catch::clog(), m_rss.get() )
    {}